

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

ZSTD_DDict * ZSTD_getDDict(ZSTD_DCtx *dctx)

{
  ZSTD_dictUses_e ZVar1;
  ZSTD_DCtx *dctx_local;
  
  ZVar1 = dctx->dictUses;
  if (ZVar1 == ZSTD_use_indefinitely) {
    dctx_local = (ZSTD_DCtx *)dctx->ddict;
  }
  else if (ZVar1 == ZSTD_dont_use) {
    ZSTD_clearDict(dctx);
    dctx_local = (ZSTD_DCtx *)0x0;
  }
  else {
    if (ZVar1 != ZSTD_use_once) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                    ,0x487,"const ZSTD_DDict *ZSTD_getDDict(ZSTD_DCtx *)");
    }
    dctx->dictUses = ZSTD_dont_use;
    dctx_local = (ZSTD_DCtx *)dctx->ddict;
  }
  return (ZSTD_DDict *)dctx_local;
}

Assistant:

static ZSTD_DDict const* ZSTD_getDDict(ZSTD_DCtx* dctx)
{
    switch (dctx->dictUses) {
    default:
        assert(0 /* Impossible */);
        ZSTD_FALLTHROUGH;
    case ZSTD_dont_use:
        ZSTD_clearDict(dctx);
        return NULL;
    case ZSTD_use_indefinitely:
        return dctx->ddict;
    case ZSTD_use_once:
        dctx->dictUses = ZSTD_dont_use;
        return dctx->ddict;
    }
}